

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_decode_cyc(pt_packet_decoder *decoder,pt_packet *packet)

{
  int iVar1;
  int errcode;
  int size;
  pt_packet *packet_local;
  pt_packet_decoder *decoder_local;
  
  if ((decoder == (pt_packet_decoder *)0x0) || (packet == (pt_packet *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else {
    iVar1 = pt_pkt_read_cyc(&(packet->payload).cyc,decoder->pos,&decoder->config);
    decoder_local._4_4_ = iVar1;
    if (-1 < iVar1) {
      packet->type = ppt_cyc;
      packet->size = (uint8_t)iVar1;
      if (((*(ushort *)&(decoder->config).errata >> 2 & 1) == 0) ||
         (decoder_local._4_4_ = pt_pkt_handle_skd007(decoder,packet), decoder_local._4_4_ == 0)) {
        decoder_local._4_4_ = iVar1;
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_pkt_decode_cyc(struct pt_packet_decoder *decoder,
			     struct pt_packet *packet)
{
	int size, errcode;

	if (!decoder || !packet)
		return -pte_internal;

	size = pt_pkt_read_cyc(&packet->payload.cyc, decoder->pos,
			       &decoder->config);
	if (size < 0)
		return size;

	packet->type = ppt_cyc;
	packet->size = (uint8_t) size;

	if (decoder->config.errata.skd007) {
		errcode = pt_pkt_handle_skd007(decoder, packet);
		if (errcode != 0)
			return errcode;
	}

	return size;
}